

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void nivalis::detail::sub_var_ast(AST *ast,int64_t addr,double value)

{
  uint uVar1;
  pointer pAVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  lVar3 = 8;
  for (uVar4 = 0;
      pAVar2 = (ast->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(ast->
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4);
      uVar4 = uVar4 + 1) {
    uVar1 = *(uint *)((long)pAVar2 + lVar3 + -8);
    if (((uVar1 < 0x13) && ((0x60004U >> (uVar1 & 0x1f) & 1) != 0)) &&
       (*(long *)((long)&pAVar2->opcode + lVar3) == addr)) {
      *(undefined4 *)((long)pAVar2 + lVar3 + -8) = 1;
      *(double *)((long)&pAVar2->opcode + lVar3) = value;
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void sub_var_ast(Expr::AST& ast, int64_t addr, double value) {
    for (size_t i = 0; i < ast.size(); ++i) {
        if (OpCode::has_ref(ast[i].opcode) &&
            ast[i].opcode != OpCode::arg &&
            ast[i].ref == addr) {
            ast[i].opcode = OpCode::val;
            ast[i].val = value;
        }
    }
}